

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O2

void __thiscall spv::Instruction::setIdOperand(Instruction *this,uint idx,Id id)

{
  uint __line;
  char *__assertion;
  reference rVar1;
  
  if (id == 0) {
    __assertion = "id";
    __line = 0x71;
  }
  else {
    rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->idOperand,(ulong)idx);
    if ((*rVar1._M_p & rVar1._M_mask) != 0) {
      (this->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[idx] = id;
      return;
    }
    __assertion = "idOperand[idx]";
    __line = 0x72;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,__line,"void spv::Instruction::setIdOperand(unsigned int, Id)");
}

Assistant:

void setIdOperand(unsigned idx, Id id) {
        assert(id);
        assert(idOperand[idx]);
        operands[idx] = id;
    }